

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void __thiscall CSHA1::Finalize(CSHA1 *this,uchar *hash)

{
  uchar *in_RSI;
  CSHA1 *in_RDI;
  long in_FS_OFFSET;
  uchar sizedesc [8];
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uchar *ptr;
  CSHA1 *this_00;
  uchar local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = local_10;
  this_00 = in_RDI;
  WriteBE64(ptr,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  Write(this_00,in_RSI,(size_t)in_RDI);
  Write(this_00,in_RSI,(size_t)in_RDI);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  WriteBE32(ptr,in_stack_ffffffffffffffcc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSHA1::Finalize(unsigned char hash[OUTPUT_SIZE])
{
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    WriteBE64(sizedesc, bytes << 3);
    Write(pad, 1 + ((119 - (bytes % 64)) % 64));
    Write(sizedesc, 8);
    WriteBE32(hash, s[0]);
    WriteBE32(hash + 4, s[1]);
    WriteBE32(hash + 8, s[2]);
    WriteBE32(hash + 12, s[3]);
    WriteBE32(hash + 16, s[4]);
}